

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool util::PrintRecords(SelectStatement *stmt,
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                       *cols,table *t,int *selectvalue)

{
  value_type_conflict vVar1;
  undefined8 uVar2;
  byte bVar3;
  bool bVar4;
  __type _Var5;
  _Setfill<char> _Var6;
  _Ios_Openmode _Var7;
  int iVar8;
  int iVar9;
  _Setw _Var10;
  ostream *poVar11;
  reference ppcVar12;
  reference ppVar13;
  char *str2;
  int *piVar14;
  ulong uVar15;
  int local_6ec;
  int local_53c;
  char *bytes_2;
  __mbstate_t local_4a8;
  int *local_4a0;
  column *col_4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  it_2;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *__range2;
  char *curbytes;
  __mbstate_t local_448;
  char *local_440;
  char *prebytes;
  __mbstate_t local_430;
  int *local_428;
  column *col_3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  it_1;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *__range3;
  int countcol;
  int count_duplicates;
  int *local_3d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3c0;
  int local_3b8;
  byte local_3b1;
  int j;
  bool duplicates;
  char *bytes_1;
  __mbstate_t local_3a0;
  column *local_398;
  column *col_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<column_*,_std::allocator<column_*>_> *__range4_1;
  column *tempcol_1;
  char *compareChar;
  string colName_1;
  char *bytes;
  __mbstate_t local_338;
  column *local_330;
  column *col_1;
  iterator __end4;
  iterator __begin4;
  vector<column_*,_std::allocator<column_*>_> *__range4;
  column *tempcol;
  string local_300 [4];
  int compareNum;
  string colName;
  value_type_conflict local_2dc;
  undefined1 local_2d8 [4];
  int i;
  vector<int,_std::allocator<int>_> printedrecords;
  column *col;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*> it
  ;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *__range1;
  ifstream os;
  int *selectvalue_local;
  table *t_local;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *cols_local;
  SelectStatement *stmt_local;
  
  table::getName_abi_cxx11_((table *)&stack0xfffffffffffffda8);
  _Var7 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&stack0xfffffffffffffdc8,(string *)&stack0xfffffffffffffda8,_Var7);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    poVar11 = std::operator<<((ostream *)&std::cout,"Can\'t open table ");
    poVar11 = std::operator<<(poVar11,stmt->fromTable->name);
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    stmt_local._7_1_ = 0;
  }
  else {
    bVar4 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
            ::empty(cols);
    if (bVar4) {
      stmt_local._7_1_ = 0;
    }
    else {
      __end1 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
               ::begin(cols);
      it.second = (column *)
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                  ::end(cols);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                                         *)&it.second), bVar4) {
        ppVar13 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                  ::operator*(&__end1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                *)&col,ppVar13);
        uVar2 = it._24_8_;
        if ((it._24_8_ == 0) ||
           (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(it._24_8_ + 0x30),"INT"), bVar4)) {
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
          _Var10 = std::setw(8);
          poVar11 = std::operator<<(poVar11,_Var10);
          _Var6 = std::setfill<char>(' ');
          poVar11 = std::operator<<(poVar11,_Var6._M_c);
          std::operator<<(poVar11,(string *)&col);
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(uVar2 + 0x30),"CHAR");
          if (bVar4) {
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
            if (*(int *)(uVar2 + 4) + 2 < 9) {
              local_53c = 8;
            }
            else {
              local_53c = *(int *)(uVar2 + 4) + 2;
            }
            printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = std::setw(local_53c);
            poVar11 = std::operator<<(poVar11,printedrecords.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage._4_4_);
            printedrecords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ = std::setfill<char>(' ');
            poVar11 = std::operator<<(poVar11,printedrecords.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage._3_1_);
            std::operator<<(poVar11,(string *)&col);
          }
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                 *)&col);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
        ::operator++(&__end1);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_2d8)
      ;
      for (local_2dc = 0; vVar1 = local_2dc, iVar8 = table::getRowlength(t), vVar1 < iVar8;
          local_2dc = local_2dc + 1) {
        if (stmt->whereClause == (Expr *)0x0) {
LAB_0013c3a3:
          local_3b1 = 0;
          for (local_3b8 = 0; local_3b8 < local_2dc; local_3b8 = local_3b8 + 1) {
            local_3c8._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)local_2d8);
            local_3d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)local_2d8);
            local_3c0 = std::
                        find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                  (local_3c8,
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_3d0,&local_3b8);
            _countcol = std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)local_2d8);
            bVar4 = __gnu_cxx::operator==
                              (&local_3c0,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &countcol);
            if (!bVar4) {
              __range3._4_4_ = 0;
              __range3._0_4_ = 0;
              __end3 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                       ::begin(cols);
              it_1.second = (column *)
                            std::
                            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                            ::end(cols);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                                                 *)&it_1.second), bVar4) {
                ppVar13 = __gnu_cxx::
                          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                          ::operator*(&__end3);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                        *)&col_3,ppVar13);
                iVar8 = local_3b8;
                local_428 = (int *)it_1._24_8_;
                if (it_1._24_8_ != 0) {
                  iVar9 = table::getrowSize(t);
                  std::fpos<__mbstate_t>::fpos
                            ((fpos<__mbstate_t> *)&prebytes,(long)(iVar8 * iVar9 + *local_428));
                  std::istream::seekg(&stack0xfffffffffffffdc8,prebytes,local_430);
                  uVar15 = (ulong)local_428[2];
                  if ((long)uVar15 < 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  local_440 = (char *)operator_new__(uVar15);
                  std::istream::read(&stack0xfffffffffffffdc8,(long)local_440);
                  vVar1 = local_2dc;
                  iVar8 = table::getrowSize(t);
                  std::fpos<__mbstate_t>::fpos
                            ((fpos<__mbstate_t> *)&curbytes,(long)(vVar1 * iVar8 + *local_428));
                  std::istream::seekg(&stack0xfffffffffffffdc8,curbytes,local_448);
                  uVar15 = (ulong)local_428[2];
                  if ((long)uVar15 < 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  str2 = (char *)operator_new__(uVar15);
                  std::istream::read(&stack0xfffffffffffffdc8,(long)str2);
                  bVar4 = compareString(local_440,str2);
                  if (bVar4) {
                    __range3._4_4_ = __range3._4_4_ + 1;
                  }
                  __range3._0_4_ = (int)__range3 + 1;
                  if (local_440 != (char *)0x0) {
                    operator_delete(local_440);
                  }
                  if (str2 != (char *)0x0) {
                    operator_delete(str2);
                  }
                }
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                         *)&col_3);
                __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                ::operator++(&__end3);
              }
              if (__range3._4_4_ == (int)__range3) {
                local_3b1 = 1;
              }
            }
          }
          if ((local_3b1 & 1) == 0) {
            __end2 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                     ::begin(cols);
            it_2.second = (column *)
                          std::
                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                          ::end(cols);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                                               *)&it_2.second), bVar4) {
              ppVar13 = __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
                        ::operator*(&__end2);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
              ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                      *)&col_4,ppVar13);
              local_4a0 = (int *)it_2._24_8_;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_2d8,&local_2dc);
              vVar1 = local_2dc;
              if (local_4a0 == (int *)0x0) {
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
                _Var10 = std::setw(8);
                poVar11 = std::operator<<(poVar11,_Var10);
                _Var6 = std::setfill<char>(' ');
                poVar11 = std::operator<<(poVar11,_Var6._M_c);
                std::operator<<(poVar11,(string *)&col_4);
              }
              else {
                iVar8 = table::getrowSize(t);
                std::fpos<__mbstate_t>::fpos
                          ((fpos<__mbstate_t> *)&bytes_2,(long)(vVar1 * iVar8 + *local_4a0));
                std::istream::seekg(&stack0xfffffffffffffdc8,bytes_2,local_4a8);
                uVar15 = (ulong)local_4a0[2];
                if ((long)uVar15 < 0) {
                  uVar15 = 0xffffffffffffffff;
                }
                piVar14 = (int *)operator_new__(uVar15);
                std::istream::read(&stack0xfffffffffffffdc8,(long)piVar14);
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(local_4a0 + 0xc),"INT");
                if (bVar4) {
                  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
                  _Var10 = std::setw(8);
                  poVar11 = std::operator<<(poVar11,_Var10);
                  _Var6 = std::setfill<char>(' ');
                  poVar11 = std::operator<<(poVar11,_Var6._M_c);
                  std::ostream::operator<<(poVar11,*piVar14);
                  *selectvalue = *piVar14;
                }
                else {
                  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
                  if (local_4a0[1] + 2 < 9) {
                    local_6ec = 8;
                  }
                  else {
                    local_6ec = local_4a0[1] + 2;
                  }
                  _Var10 = std::setw(local_6ec);
                  poVar11 = std::operator<<(poVar11,_Var10);
                  _Var6 = std::setfill<char>(' ');
                  poVar11 = std::operator<<(poVar11,_Var6._M_c);
                  std::operator<<(poVar11,(char *)piVar14);
                }
                if (piVar14 != (int *)0x0) {
                  operator_delete(piVar14);
                }
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                       *)&col_4);
              __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>_>
              ::operator++(&__end2);
            }
            std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          if (((stmt->whereClause->type != kExprOperator) ||
              (stmt->whereClause->opType != SIMPLE_OP)) ||
             ((stmt->whereClause->opChar != '=' &&
              ((stmt->whereClause->opChar != '>' && (stmt->whereClause->opChar != '<')))))) {
            poVar11 = std::operator<<((ostream *)&std::cout,"Invalide where clause");
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            stmt_local._7_1_ = 0;
            goto LAB_0013cbc4;
          }
          if ((stmt->whereClause->expr2->type == kExprLiteralInt) ||
             (stmt->whereClause->expr->type == kExprLiteralInt)) {
            std::__cxx11::string::string(local_300);
            if (stmt->whereClause->expr2->type == kExprLiteralInt) {
              if (stmt->whereClause->expr->type == kExprLiteralString) {
                poVar11 = std::operator<<((ostream *)&std::cout,
                                          "cannot do compare between int and char");
                std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                stmt_local._7_1_ = 0;
                __range1._0_4_ = 1;
              }
              else {
                std::__cxx11::string::operator=(local_300,stmt->whereClause->expr->name);
                tempcol._4_4_ = (int)stmt->whereClause->expr2->ival;
LAB_0013ba84:
                __range4 = (vector<column_*,_std::allocator<column_*>_> *)0x0;
                __end4 = std::vector<column_*,_std::allocator<column_*>_>::begin(&t->table_cols);
                col_1 = (column *)
                        std::vector<column_*,_std::allocator<column_*>_>::end(&t->table_cols);
                while (bVar4 = __gnu_cxx::operator!=
                                         (&__end4,(
                                                  __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                                                  *)&col_1), vVar1 = local_2dc, bVar4) {
                  ppcVar12 = __gnu_cxx::
                             __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                             ::operator*(&__end4);
                  local_330 = *ppcVar12;
                  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_300,&local_330->name);
                  if (_Var5) {
                    __range4 = (vector<column_*,_std::allocator<column_*>_> *)local_330;
                  }
                  __gnu_cxx::
                  __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
                  operator++(&__end4);
                }
                if (__range4 == (vector<column_*,_std::allocator<column_*>_> *)0x0) {
                  poVar11 = std::operator<<((ostream *)&std::cout,"column ");
                  poVar11 = std::operator<<(poVar11,local_300);
                  poVar11 = std::operator<<(poVar11," do not exist in table");
                  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                  stmt_local._7_1_ = 0;
                  __range1._0_4_ = 1;
                }
                else {
                  iVar8 = table::getrowSize(t);
                  std::fpos<__mbstate_t>::fpos
                            ((fpos<__mbstate_t> *)&bytes,
                             (long)(vVar1 * iVar8 +
                                   *(int *)&(__range4->
                                            super__Vector_base<column_*,_std::allocator<column_*>_>)
                                            ._M_impl.super__Vector_impl_data._M_start));
                  std::istream::seekg(&stack0xfffffffffffffdc8,bytes,local_338);
                  uVar15 = (ulong)*(int *)&(__range4->
                                           super__Vector_base<column_*,_std::allocator<column_*>_>).
                                           _M_impl.super__Vector_impl_data._M_finish;
                  if ((long)uVar15 < 0) {
                    uVar15 = 0xffffffffffffffff;
                  }
                  piVar14 = (int *)operator_new__(uVar15);
                  std::istream::read(&stack0xfffffffffffffdc8,(long)piVar14);
                  if (stmt->whereClause->opChar == '=') {
                    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(__range4 + 2),"CHAR");
                    if (bVar4) {
                      poVar11 = std::operator<<((ostream *)&std::cout,
                                                "cannot do = for char columns with int value");
                      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                      if (piVar14 != (int *)0x0) {
                        operator_delete(piVar14);
                      }
                      stmt_local._7_1_ = 0;
                      __range1._0_4_ = 1;
                    }
                    else {
                      if (*piVar14 == tempcol._4_4_) goto LAB_0013bd53;
                      if (piVar14 != (int *)0x0) {
                        operator_delete(piVar14);
                      }
                      __range1._0_4_ = 6;
                    }
                  }
                  else {
LAB_0013bd53:
                    if (stmt->whereClause->opChar == '>') {
                      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(__range4 + 2),"CHAR");
                      if (bVar4) {
                        poVar11 = std::operator<<((ostream *)&std::cout,
                                                  "cannot do > for char columns with int value");
                        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                        if (piVar14 != (int *)0x0) {
                          operator_delete(piVar14);
                        }
                        stmt_local._7_1_ = 0;
                        __range1._0_4_ = 1;
                      }
                      else {
                        if (tempcol._4_4_ < *piVar14) goto LAB_0013be39;
                        if (piVar14 != (int *)0x0) {
                          operator_delete(piVar14);
                        }
                        __range1._0_4_ = 6;
                      }
                    }
                    else {
LAB_0013be39:
                      if (stmt->whereClause->opChar == '<') {
                        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(__range4 + 2),"CHAR");
                        if (bVar4) {
                          poVar11 = std::operator<<((ostream *)&std::cout,
                                                    "cannot do < for char columns with int value");
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          if (piVar14 != (int *)0x0) {
                            operator_delete(piVar14);
                          }
                          stmt_local._7_1_ = 0;
                          __range1._0_4_ = 1;
                        }
                        else {
                          if (*piVar14 < tempcol._4_4_) goto LAB_0013bf19;
                          if (piVar14 != (int *)0x0) {
                            operator_delete(piVar14);
                          }
                          __range1._0_4_ = 6;
                        }
                      }
                      else {
LAB_0013bf19:
                        __range1._0_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
            else {
              if (stmt->whereClause->expr2->type != kExprLiteralString) {
                std::__cxx11::string::operator=(local_300,stmt->whereClause->expr2->name);
                tempcol._4_4_ = (int)stmt->whereClause->expr->ival;
                goto LAB_0013ba84;
              }
              poVar11 = std::operator<<((ostream *)&std::cout,
                                        "cannot do compare between int and char");
              std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
              stmt_local._7_1_ = 0;
              __range1._0_4_ = 1;
            }
            std::__cxx11::string::~string(local_300);
            if ((int)__range1 == 0) goto LAB_0013bf57;
          }
          else {
LAB_0013bf57:
            if ((stmt->whereClause->expr->type == kExprColumnRef) &&
               (stmt->whereClause->expr2->type == kExprColumnRef)) goto LAB_0013cb94;
            if ((stmt->whereClause->expr2->type != kExprLiteralString) &&
               (stmt->whereClause->expr->type != kExprLiteralString)) goto LAB_0013c3a3;
            std::__cxx11::string::string((string *)&compareChar);
            if (stmt->whereClause->expr2->type == kExprLiteralString) {
              std::__cxx11::string::operator=((string *)&compareChar,stmt->whereClause->expr->name);
              tempcol_1 = (column *)stmt->whereClause->expr2->name;
            }
            else {
              std::__cxx11::string::operator=((string *)&compareChar,stmt->whereClause->expr2->name)
              ;
              tempcol_1 = (column *)stmt->whereClause->expr->name;
            }
            __range4_1 = (vector<column_*,_std::allocator<column_*>_> *)0x0;
            __end4_1 = std::vector<column_*,_std::allocator<column_*>_>::begin(&t->table_cols);
            col_2 = (column *)std::vector<column_*,_std::allocator<column_*>_>::end(&t->table_cols);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end4_1,
                                      (__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                                       *)&col_2), vVar1 = local_2dc, bVar4) {
              ppcVar12 = __gnu_cxx::
                         __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                         ::operator*(&__end4_1);
              local_398 = *ppcVar12;
              _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&compareChar,&local_398->name);
              if (_Var5) {
                __range4_1 = (vector<column_*,_std::allocator<column_*>_> *)local_398;
              }
              __gnu_cxx::
              __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
              operator++(&__end4_1);
            }
            if (__range4_1 == (vector<column_*,_std::allocator<column_*>_> *)0x0) {
              poVar11 = std::operator<<((ostream *)&std::cout,"column ");
              poVar11 = std::operator<<(poVar11,(string *)&compareChar);
              poVar11 = std::operator<<(poVar11," do not exist in table");
              std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
              stmt_local._7_1_ = 0;
              __range1._0_4_ = 1;
            }
            else {
              iVar8 = table::getrowSize(t);
              std::fpos<__mbstate_t>::fpos
                        ((fpos<__mbstate_t> *)&bytes_1,
                         (long)(vVar1 * iVar8 +
                               *(int *)&(__range4_1->
                                        super__Vector_base<column_*,_std::allocator<column_*>_>).
                                        _M_impl.super__Vector_impl_data._M_start));
              std::istream::seekg(&stack0xfffffffffffffdc8,bytes_1,local_3a0);
              uVar15 = (ulong)*(int *)&(__range4_1->
                                       super__Vector_base<column_*,_std::allocator<column_*>_>).
                                       _M_impl.super__Vector_impl_data._M_finish;
              if ((long)uVar15 < 0) {
                uVar15 = 0xffffffffffffffff;
              }
              _j = (char *)operator_new__(uVar15);
              std::istream::read(&stack0xfffffffffffffdc8,(long)_j);
              if (stmt->whereClause->opChar == '=') {
                bVar4 = compareString(_j,(char *)tempcol_1);
                if (bVar4) goto LAB_0013c363;
                if (_j != (char *)0x0) {
                  operator_delete(_j);
                }
                __range1._0_4_ = 6;
              }
              else if (stmt->whereClause->opChar == '>') {
                iVar8 = util::compareChar(_j,(char *)tempcol_1);
                if (iVar8 == 1) {
LAB_0013c363:
                  __range1._0_4_ = 0;
                }
                else {
                  if (_j != (char *)0x0) {
                    operator_delete(_j);
                  }
                  __range1._0_4_ = 6;
                }
              }
              else {
                if ((stmt->whereClause->opChar != '<') ||
                   (iVar8 = util::compareChar(_j,(char *)tempcol_1), iVar8 == -1))
                goto LAB_0013c363;
                if (_j != (char *)0x0) {
                  operator_delete(_j);
                }
                __range1._0_4_ = 6;
              }
            }
            std::__cxx11::string::~string((string *)&compareChar);
            if ((int)__range1 == 0) goto LAB_0013c3a3;
          }
          if ((int)__range1 != 6) goto LAB_0013cbc4;
        }
LAB_0013cb94:
      }
      std::ifstream::close();
      stmt_local._7_1_ = 1;
LAB_0013cbc4:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_2d8);
    }
  }
  std::ifstream::~ifstream(&stack0xfffffffffffffdc8);
  return (bool)(stmt_local._7_1_ & 1);
}

Assistant:

bool util::PrintRecords(hsql::SelectStatement *stmt, vector<pair<string, column*>> cols, table* t, int &selectvalue){
    ifstream os(t->getName(), ios::in|ios::binary);

    if(!os.is_open()){
        cout <<"Can't open table "<< stmt->fromTable->name  <<endl;
        return false;
    }
    if(cols.empty()){
        return false;
    }
    // header
    for(auto it : cols){
        column* col = it.second;
        if(col == NULL || col->flag == "INT")
            cout <<left<<setw(8)<<setfill(' ')<<it.first;
        else if(col->flag == "CHAR")
            cout <<left<<setw(col->element_size +2 > 8 ? col->element_size+2 : 8)<<setfill(' ')<<it.first;
    }
    cout << endl;

    vector<int> printedrecords;
    //print records
    for(int i = 0; i < t->getRowlength(); i++){

        //where condition
        if(stmt->whereClause != NULL){
            if(stmt->whereClause->type != hsql::kExprOperator ||
               stmt->whereClause->opType != hsql::Expr::SIMPLE_OP||
               (stmt->whereClause->opChar != '=' && stmt->whereClause->opChar != '>'&&
                stmt->whereClause->opChar != '<')){
                cout <<"Invalide where clause"<<endl;
                return false;
            }
            //deal with int
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt||stmt->whereClause->expr->type == hsql::kExprLiteralInt){
                //select column
                string colName;
                int compareNum;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt) {
                    if(stmt->whereClause->expr->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr->name;
                    compareNum = (int) stmt->whereClause->expr2->ival;
                }
                else {
                    if(stmt->whereClause->expr2->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr2->name;
                    compareNum = (int) stmt->whereClause->expr->ival;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do = for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if(stmt->whereClause->opChar == '>'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do > for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes <= compareNum){
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if(stmt->whereClause->opChar == '<'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do < for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes >= compareNum){
                        delete bytes;
                        continue;
                    }
                }

            }
            if(stmt->whereClause->expr->type == hsql::kExprColumnRef&&stmt->whereClause->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralString||stmt->whereClause->expr->type == hsql::kExprLiteralString){
                //select column
                string colName;
                char* compareChar;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->whereClause->expr->name;
                    compareChar = stmt->whereClause->expr2->name;
                }
                else {
                    colName = stmt->whereClause->expr2->name;
                    compareChar = stmt->whereClause->expr->name;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if (!util::compareString(bytes ,compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if(stmt->whereClause->opChar == '>'){
                    if(util::compareChar(bytes, compareChar) != 1){
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if(stmt->whereClause->opChar == '<'){
                    if(util::compareChar(bytes, compareChar) != -1){
                        delete bytes;
                        continue;
                    }
                }

            }

        }
        //check duplicates
        bool duplicates = false;
        for(int j = 0; j<i; j++){
            if(find(printedrecords.begin(), printedrecords.end(), j)== printedrecords.end())
                continue;
            int count_duplicates = 0;
            int countcol = 0;
            for(auto it:cols){
                column* col = it.second;
                if (col!=NULL){
                    os.seekg(j * t->getrowSize() + col->col_offset);
                    char* prebytes = new char[col->element_truesize];
                    os.read(prebytes, col->element_truesize);

                    os.seekg(i * t->getrowSize() + col->col_offset);
                    char* curbytes = new char[col->element_truesize];
                    os.read(curbytes, col->element_truesize);
                    if(util::compareString(prebytes, curbytes))
                        count_duplicates += 1;
                    countcol += 1;
                    delete prebytes;
                    delete curbytes;
                }

            }
            if(count_duplicates == countcol)
                duplicates = true;
        }
        if(duplicates)
            continue;
        //do print

        for(auto it:cols) {
            column *col = it.second;
            printedrecords.push_back(i);

            if (col != NULL) {

                os.seekg(i * t->getrowSize() + col->col_offset);
                char *bytes = new char[col->element_truesize];
                //cout << "bytes: " << bytes << " -- true size: " << col->element_truesize << endl;
                os.read(bytes, col->element_truesize);


                if ( col->flag == "INT"){
                    cout << left << setw(8) << setfill(' ') << *(int *) bytes;
                    selectvalue = *(int *) bytes;

                }

                else {
                    cout << left << setw(col->element_size + 2 > 8 ? col->element_size + 2 : 8)
                         << setfill(' ') << bytes;
                }

                delete bytes;

            } else {
                cout << left << setw(8) << setfill(' ') << it.first;
            }
        }
        cout << endl;
    }
    os.close();
    return true;
}